

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::ast::PortConnection_const*>::
emplace_back<slang::ast::PortConnection_const*const&>
          (SmallVectorBase<const_slang::ast::PortConnection_*> *this,PortConnection **args)

{
  iterator ppPVar1;
  undefined8 *in_RSI;
  SmallVectorBase<const_slang::ast::PortConnection_*> *in_RDI;
  PortConnection **in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<const_slang::ast::PortConnection_*> *in_stack_00000030;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    SmallVectorBase<const_slang::ast::PortConnection_*>::end(in_RDI);
    local_8 = emplaceRealloc<slang::ast::PortConnection_const*const&>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    ppPVar1 = SmallVectorBase<const_slang::ast::PortConnection_*>::end(in_RDI);
    *ppPVar1 = (PortConnection *)*in_RSI;
    in_RDI->len = in_RDI->len + 1;
    local_8 = SmallVectorBase<const_slang::ast::PortConnection_*>::back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }